

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O2

void XCore_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  int OpNum;
  char *s;
  
  uVar1 = MCInst_getOpcode(MI);
  uVar1 = *(uint *)(printInstruction_OpInfo + (ulong)uVar1 * 4);
  s = (char *)((ulong)(uVar1 & 0x7ff) + 0x38e22f);
  SStream_concat0(O,s);
  pcVar3 = strchr(s,0x5b);
  if (pcVar3 != (char *)0x0) {
    set_mem_access(MI,true,0);
  }
  switch(uVar1 >> 0xb & 3) {
  case 0:
    XCore_insn_extract(MI,s);
    goto switchD_001be3c1_caseD_1;
  case 1:
    iVar4 = 0;
    break;
  case 2:
    iVar4 = 1;
    break;
  case 3:
    iVar4 = 2;
  }
  printOperand(MI,iVar4,O);
  switch(uVar1 >> 0xd & 0x1f) {
  case 1:
    goto switchD_001be3c1_caseD_1;
  case 2:
    goto switchD_001be3c1_caseD_2;
  case 3:
    pcVar3 = "\n";
    goto LAB_001be58b;
  case 4:
    SStream_concat0(O,"], ");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
    }
    goto LAB_001be593;
  case 5:
    SStream_concat0(O,", res[");
    set_mem_access(MI,true,0);
    goto LAB_001be593;
  case 6:
    SStream_concat0(O,", ps[");
    iVar4 = 0;
    goto LAB_001be4fd;
  case 7:
    SStream_concat0(O,"]:cp, ");
    iVar4 = 1;
    break;
  case 8:
    SStream_concat0(O,"]:dp, ");
    iVar4 = 2;
    break;
  case 9:
    SStream_concat0(O,"]:lr, ");
    iVar4 = 3;
    break;
  case 10:
    SStream_concat0(O,"]:pc, ");
    iVar4 = 0x11;
    break;
  case 0xb:
    SStream_concat0(O,"]:sp, ");
    iVar4 = 4;
    break;
  case 0xc:
    SStream_concat0(O,", dp[");
    iVar4 = 2;
    goto LAB_001be4fd;
  case 0xd:
    SStream_concat0(O,", sp[");
    iVar4 = 4;
    goto LAB_001be4fd;
  case 0xe:
    SStream_concat0(O,", cp[");
    iVar4 = 1;
LAB_001be4fd:
    OpNum = 1;
    set_mem_access(MI,true,iVar4);
LAB_001be507:
    printOperand(MI,OpNum,O);
switchD_001be3c1_caseD_2:
    pcVar3 = "]";
LAB_001be516:
    SStream_concat0(O,pcVar3);
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
    }
    goto switchD_001be3c1_caseD_1;
  case 0xf:
    pcVar3 = "], r11";
    goto LAB_001be516;
  case 0x10:
    SStream_concat0(O,"]:r");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
    }
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iVar4 = 1;
    goto LAB_001be7f7;
  default:
    pcVar3 = ", ";
LAB_001be58b:
    SStream_concat0(O,pcVar3);
LAB_001be593:
    uVar2 = uVar1 >> 0x12 & 7;
    if (uVar2 - 2 < 2) goto switchD_001be3c1_caseD_1;
    if (uVar2 == 1) {
      printOperand(MI,2,O);
      switch(uVar1 >> 0x15 & 7) {
      case 0:
        goto switchD_001be5e5_caseD_0;
      case 1:
        goto switchD_001be3c1_caseD_1;
      case 2:
        goto switchD_001be5e5_caseD_2;
      case 4:
        goto switchD_001be5e5_caseD_4;
      case 5:
        goto switchD_001be5e5_caseD_5;
      case 6:
        goto switchD_001be5e5_caseD_6;
      case 7:
        goto switchD_001be5e5_caseD_7;
      }
      goto switchD_001be3c1_caseD_2;
    }
    if (uVar2 != 4) {
      printOperand(MI,1,O);
      switch(uVar1 >> 0x15 & 7) {
      case 0:
        goto switchD_001be5e5_caseD_0;
      case 1:
        goto switchD_001be3c1_caseD_1;
      case 2:
        goto switchD_001be5e5_caseD_2;
      case 4:
        goto switchD_001be5e5_caseD_4;
      case 5:
        goto switchD_001be5e5_caseD_5;
      case 6:
        goto switchD_001be5e5_caseD_6;
      case 7:
        goto switchD_001be5e5_caseD_7;
      }
      goto switchD_001be3c1_caseD_2;
    }
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    switch(uVar1 >> 0x15 & 7) {
    case 0:
switchD_001be5e5_caseD_0:
      SStream_concat0(O,", ");
      break;
    case 1:
      goto switchD_001be3c1_caseD_1;
    case 2:
switchD_001be5e5_caseD_2:
      printOperand(MI,3,O);
      goto LAB_001be6fb;
    case 3:
      goto switchD_001be3c1_caseD_2;
    case 4:
switchD_001be5e5_caseD_4:
      SStream_concat0(O,"], ");
      if (MI->csh->detail == CS_OPT_ON) {
        MI->csh->doing_mem = false;
      }
      iVar4 = 2;
      goto LAB_001be7f7;
    case 5:
switchD_001be5e5_caseD_5:
      printOperand(MI,2,O);
      break;
    case 6:
switchD_001be5e5_caseD_6:
      SStream_concat0(O,"[");
      iVar4 = 0xffff;
      goto LAB_001be721;
    case 7:
switchD_001be5e5_caseD_7:
      SStream_concat0(O,"[-");
      iVar4 = -0xffff;
LAB_001be721:
      set_mem_access(MI,true,iVar4);
      OpNum = 2;
      goto LAB_001be507;
    }
    switch(uVar1 >> 0x18 & 7) {
    case 2:
      SStream_concat0(O,", ");
      printOperand(MI,3,O);
LAB_001be6fb:
      SStream_concat0(O,", ");
      iVar4 = 4;
      break;
    case 3:
      printOperand(MI,4,O);
      SStream_concat0(O,", ");
      switch(uVar1 >> 0x1b & 3) {
      case 0:
        goto switchD_001be3c1_caseD_1;
      case 1:
        goto switchD_001be78a_caseD_1;
      case 2:
switchD_001be78a_caseD_2:
        SStream_concat0(O,", ");
        printOperand(MI,3,O);
        SStream_concat0(O,", ");
        printOperand(MI,4,O);
        SStream_concat0(O,", ");
      case 3:
switchD_001be78a_caseD_3:
        iVar4 = 5;
      }
      break;
    case 4:
      goto switchD_001be3c1_caseD_1;
    default:
      printOperand(MI,2,O);
      switch(uVar1 >> 0x1b & 3) {
      case 0:
        goto switchD_001be3c1_caseD_1;
      case 2:
        goto switchD_001be78a_caseD_2;
      case 3:
        goto switchD_001be78a_caseD_3;
      }
switchD_001be78a_caseD_1:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
    case 1:
      iVar4 = 3;
    }
    goto LAB_001be7f7;
  }
  set_mem_access(MI,false,iVar4);
  iVar4 = 0;
LAB_001be7f7:
  printOperand(MI,iVar4,O);
switchD_001be3c1_caseD_1:
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
  }
  return;
}

Assistant:

void XCore_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
	set_mem_access(MI, false, 0);
}